

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.cc
# Opt level: O2

void __thiscall
iqxmlrpc::Parser::Impl::ParseStep::ParseStep(ParseStep *this,int type,xmlTextReaderPtr reader)

{
  int iVar1;
  bool bVar2;
  
  this->done = false;
  this->element_end = type == 0xf;
  this->element_begin = type == 1;
  if (type == 1) {
    iVar1 = xmlTextReaderIsEmptyElement(reader);
    bVar2 = iVar1 != 0;
  }
  else {
    bVar2 = false;
  }
  this->is_empty = bVar2;
  this->is_text = type == 3;
  return;
}

Assistant:

ParseStep(int type, xmlTextReaderPtr reader):
      done(false),
      element_begin(type == XML_READER_TYPE_ELEMENT),
      element_end(type == XML_READER_TYPE_END_ELEMENT),
      is_empty(element_begin && xmlTextReaderIsEmptyElement(reader)),
      is_text(type == XML_READER_TYPE_TEXT)
    {
    }